

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void InitParameterInteraction(ArgsManager *args)

{
  ConstevalFormatString<0U> fmt;
  ConstevalFormatString<0U> fmt_00;
  ConstevalFormatString<0U> fmt_01;
  ConstevalFormatString<0U> fmt_02;
  ConstevalFormatString<0U> fmt_03;
  ConstevalFormatString<0U> fmt_04;
  ConstevalFormatString<0U> fmt_05;
  ConstevalFormatString<0U> fmt_06;
  ConstevalFormatString<0U> fmt_07;
  ConstevalFormatString<0U> fmt_08;
  ConstevalFormatString<0U> fmt_09;
  ConstevalFormatString<0U> fmt_10;
  ConstevalFormatString<0U> fmt_11;
  ConstevalFormatString<0U> fmt_12;
  ConstevalFormatString<0U> fmt_13;
  ConstevalFormatString<1U> fmt_14;
  ConstevalFormatString<0U> fmt_15;
  ConstevalFormatString<0U> fmt_16;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view source_file_14;
  string_view source_file_15;
  string_view source_file_16;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  string_view logging_function_14;
  string_view logging_function_15;
  string_view logging_function_16;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  int64_t iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  bool clearnet_reachable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  string proxy_arg;
  undefined4 in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff53c;
  char *in_stack_fffffffffffff540;
  uint *in_stack_fffffffffffff548;
  char *in_stack_fffffffffffff550;
  string *in_stack_fffffffffffff558;
  undefined6 in_stack_fffffffffffff560;
  undefined1 in_stack_fffffffffffff566;
  undefined1 in_stack_fffffffffffff567;
  string *in_stack_fffffffffffff568;
  ArgsManager *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff578;
  undefined1 in_stack_fffffffffffff57f;
  byte bVar8;
  char *in_stack_fffffffffffff580;
  char *__s;
  undefined7 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58f;
  ArgsManager *in_stack_fffffffffffff590;
  undefined7 in_stack_fffffffffffff5a0;
  undefined1 in_stack_fffffffffffff5a7;
  undefined8 in_stack_fffffffffffff5a8;
  int iVar9;
  ArgsManager *strArg;
  ArgsManager *pAVar10;
  undefined7 in_stack_fffffffffffff5e8;
  byte in_stack_fffffffffffff5ef;
  ArgsManager *in_stack_fffffffffffff5f0;
  allocator<char> *in_stack_fffffffffffff5f8;
  undefined7 in_stack_fffffffffffff600;
  byte in_stack_fffffffffffff607;
  ArgsManager *in_stack_fffffffffffff608;
  Level in_stack_fffffffffffff6e0;
  Level level;
  undefined7 in_stack_fffffffffffff6f0;
  byte in_stack_fffffffffffff6f7;
  allocator<char> local_6d2;
  allocator<char> local_6d1;
  char local_6d0 [31];
  undefined1 local_6b1 [40];
  allocator<char> local_689 [40];
  allocator<char> local_661 [39];
  allocator<char> local_63a;
  allocator<char> local_639 [39];
  allocator<char> local_612;
  allocator<char> local_611 [40];
  allocator<char> local_5e9 [40];
  allocator<char> local_5c1 [40];
  allocator<char> local_599 [40];
  allocator<char> local_571 [39];
  allocator<char> local_54a;
  allocator<char> local_549 [40];
  allocator<char> local_521 [40];
  allocator<char> local_4f9 [40];
  allocator<char> local_4d1 [38];
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9 [40];
  allocator<char> local_481 [38];
  allocator<char> local_45b;
  allocator<char> local_45a;
  allocator<char> local_459 [39];
  allocator<char> local_432;
  allocator<char> local_431 [39];
  allocator<char> local_40a;
  allocator<char> local_409 [1025];
  long local_8;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar1 = ArgsManager::IsArgSet
                    ((ArgsManager *)
                     CONCAT17(in_stack_fffffffffffff567,
                              CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)),
                     in_stack_fffffffffffff558);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_409);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_40a);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff538 = 2;
      in_stack_fffffffffffff540 = "parameter interaction: -bind set -> setting -listen=1\n";
      logging_function._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function._M_str = (char *)in_stack_fffffffffffff608;
      source_file._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function,source_file,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar1 = ArgsManager::IsArgSet
                    ((ArgsManager *)
                     CONCAT17(in_stack_fffffffffffff567,
                              CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)),
                     in_stack_fffffffffffff558);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_431);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_432);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff538 = 2;
      in_stack_fffffffffffff540 = "parameter interaction: -whitebind set -> setting -listen=1\n";
      logging_function_00._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_00._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_00._M_str = (char *)in_stack_fffffffffffff608;
      source_file_00._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_00._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_00.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_00.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_00);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar2 = ArgsManager::IsArgSet
                    ((ArgsManager *)
                     CONCAT17(in_stack_fffffffffffff567,
                              CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)),
                     in_stack_fffffffffffff558);
  bVar1 = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    iVar5 = ArgsManager::GetIntArg
                      ((ArgsManager *)in_stack_fffffffffffff540,
                       (string *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                       (int64_t)in_stack_fffffffffffff548);
    bVar1 = iVar5 < 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_45a);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_459);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_45b);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff538 = 2;
      in_stack_fffffffffffff540 =
           "parameter interaction: -connect or -maxconnections=0 set -> setting -dnsseed=0\n";
      logging_function_01._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_01._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_01._M_str = (char *)in_stack_fffffffffffff608;
      source_file_01._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_01._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_01.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_01.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_01,source_file_01,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_01);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_481);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff538 = 2;
      in_stack_fffffffffffff540 =
           "parameter interaction: -connect or -maxconnections=0 set -> setting -listen=0\n";
      logging_function_02._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_02._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_02._M_str = (char *)in_stack_fffffffffffff608;
      source_file_02._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_02._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_02.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_02.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_02);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  ArgsManager::GetArg((ArgsManager *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                      (string *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(&local_4aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_4a9);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  if ((((bVar1 ^ 0xffU) & 1) != 0) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff548,in_stack_fffffffffffff540),
     ((bVar1 ^ 0xffU) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_4ab);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -proxy set -> setting -listen=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_03._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_03._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_03._M_str = (char *)in_stack_fffffffffffff608;
      source_file_03._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_03._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_03.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_03.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_03,source_file_03,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_03);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_4d1);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -proxy set -> setting -upnp=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_04._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_04._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_04._M_str = (char *)in_stack_fffffffffffff608;
      source_file_04._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_04._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_04.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_04.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_04,source_file_04,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_04);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_4f9);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -proxy set -> setting -natpmp=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_05._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_05._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_05._M_str = (char *)in_stack_fffffffffffff608;
      source_file_05._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_05._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_05.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_05.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_05,source_file_05,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_05);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    in_stack_fffffffffffff6f7 =
         ArgsManager::SoftSetBoolArg
                   (in_stack_fffffffffffff590,
                    (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                    SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_521);
    if ((in_stack_fffffffffffff6f7 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -proxy set -> setting -discover=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_06._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_06._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_06._M_str = (char *)in_stack_fffffffffffff608;
      source_file_06._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_06._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_06.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_06.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_06,source_file_06,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                 in_stack_fffffffffffff6e0,fmt_06);
    }
  }
  pAVar10 = in_RDI;
  std::allocator<char>::allocator();
  level = (Level)pAVar10;
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff540,
                     (string *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                     SUB81((ulong)in_stack_fffffffffffff548 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_549);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_54a);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -listen=0 -> setting -upnp=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_07._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_07._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_07._M_str = (char *)in_stack_fffffffffffff608;
      source_file_07._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_07._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_07.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_07.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_07,source_file_07,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_07);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_571);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -listen=0 -> setting -natpmp=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_08._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_08._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_08._M_str = (char *)in_stack_fffffffffffff608;
      source_file_08._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_08._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_08.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_08.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_08,source_file_08,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_08);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_599);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -listen=0 -> setting -discover=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_09._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_09._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_09._M_str = (char *)in_stack_fffffffffffff608;
      source_file_09._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_09._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_09.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_09.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_09,source_file_09,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_09);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_5c1);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -listen=0 -> setting -listenonion=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_10._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_10._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_10._M_str = (char *)in_stack_fffffffffffff608;
      source_file_10._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_10._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_10.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_10.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_10,source_file_10,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_10);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_5e9);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 =
           "parameter interaction: -listen=0 -> setting -i2pacceptincoming=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_11._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_11._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_11._M_str = (char *)in_stack_fffffffffffff608;
      source_file_11._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_11._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_11.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_11.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_11,source_file_11,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_11);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar1 = ArgsManager::IsArgSet
                    ((ArgsManager *)
                     CONCAT17(in_stack_fffffffffffff567,
                              CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)),
                     in_stack_fffffffffffff558);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_611);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_612);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 = "parameter interaction: -externalip set -> setting -discover=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_12._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_12._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_12._M_str = (char *)in_stack_fffffffffffff608;
      source_file_12._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_12._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_12.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_12.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_12,source_file_12,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_12);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff540,
                     (string *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                     SUB81((ulong)in_stack_fffffffffffff548 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_639);
  if (bVar1) {
    in_stack_fffffffffffff608 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    in_stack_fffffffffffff607 =
         ArgsManager::SoftSetBoolArg
                   (in_stack_fffffffffffff590,
                    (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                    SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_63a);
    if ((in_stack_fffffffffffff607 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 =
           "parameter interaction: -blocksonly=1 -> setting -whitelistrelay=0\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_13._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_13._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_13._M_str = (char *)in_stack_fffffffffffff608;
      source_file_13._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_13._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_13.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_13.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_13,source_file_13,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_13);
    }
    in_stack_fffffffffffff5f8 = local_661;
    in_stack_fffffffffffff5f0 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    util::ToString<unsigned_int>((uint *)in_stack_fffffffffffff570);
    in_stack_fffffffffffff5ef =
         ArgsManager::SoftSetArg
                   (in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                    (string *)
                    CONCAT17(in_stack_fffffffffffff567,
                             CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(local_661);
    if ((in_stack_fffffffffffff5ef & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff548 = &DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB;
      in_stack_fffffffffffff540 = "parameter interaction: -blocksonly=1 -> setting -maxmempool=%d\n"
      ;
      in_stack_fffffffffffff538 = 2;
      logging_function_14._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_14._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_14._M_str = (char *)in_stack_fffffffffffff608;
      source_file_14._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_14._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_14.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_14.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<unsigned_int>
                (logging_function_14,source_file_14,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_14,
                 (uint *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff540,
                     (string *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                     SUB81((ulong)in_stack_fffffffffffff548 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator(local_689);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    bVar1 = ArgsManager::SoftSetBoolArg
                      (in_stack_fffffffffffff590,
                       (string *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                       SUB81((ulong)in_stack_fffffffffffff580 >> 0x38,0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator((allocator<char> *)(local_6b1 + 0x27));
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff540 =
           "parameter interaction: -whitelistforcerelay=1 -> setting -whitelistrelay=1\n";
      in_stack_fffffffffffff538 = 2;
      logging_function_15._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_15._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_15._M_str = (char *)in_stack_fffffffffffff608;
      source_file_15._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_15._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_15.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_15.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_15,source_file_15,iVar9,
                 CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),level,fmt_15);
    }
  }
  pAVar10 = (ArgsManager *)local_6b1;
  strArg = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),in_stack_fffffffffffff580
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
  bVar3 = ArgsManager::IsArgSet
                    ((ArgsManager *)
                     CONCAT17(in_stack_fffffffffffff567,
                              CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)),
                     in_stack_fffffffffffff558);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  std::allocator<char>::~allocator((allocator<char> *)local_6b1);
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
               in_stack_fffffffffffff580,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578));
    ArgsManager::GetArgs(pAVar10,(string *)strArg);
    iVar9 = (int)((ulong)strArg >> 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
    std::allocator<char>::~allocator(&local_6d1);
    __s = local_6d0;
    cVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff540);
    cVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff540);
    uVar4 = std::
            any_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,InitParameterInteraction(ArgsManager&)::__0>
                      (cVar6._M_current,cVar7._M_current);
    bVar8 = 0;
    if (!(bool)uVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,in_stack_fffffffffffff588),__s,
                 (allocator<char> *)CONCAT17(bVar8,in_stack_fffffffffffff578));
      bVar8 = ArgsManager::SoftSetBoolArg
                        (in_RDI,(string *)CONCAT17(uVar4,in_stack_fffffffffffff588),
                         SUB81((ulong)__s >> 0x38,0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::allocator<char>::~allocator(&local_6d2);
    }
    if ((bVar8 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff558,
                 in_stack_fffffffffffff550);
      in_stack_fffffffffffff538 = 2;
      logging_function_16._M_len._7_1_ = in_stack_fffffffffffff607;
      logging_function_16._M_len._0_7_ = in_stack_fffffffffffff600;
      logging_function_16._M_str = (char *)in_stack_fffffffffffff608;
      source_file_16._M_str = (char *)in_stack_fffffffffffff5f8;
      source_file_16._M_len = (size_t)in_stack_fffffffffffff5f0;
      fmt_16.fmt._7_1_ = in_stack_fffffffffffff5ef;
      fmt_16.fmt._0_7_ = in_stack_fffffffffffff5e8;
      LogPrintFormatInternal<>
                (logging_function_16,source_file_16,iVar9,CONCAT17(bVar3,in_stack_fffffffffffff5a0),
                 level,fmt_16);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff548);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InitParameterInteraction(ArgsManager& args)
{
    // when specifying an explicit binding address, you want to listen on it
    // even when -connect or -proxy is specified
    if (args.IsArgSet("-bind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -bind set -> setting -listen=1\n");
    }
    if (args.IsArgSet("-whitebind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -whitebind set -> setting -listen=1\n");
    }

    if (args.IsArgSet("-connect") || args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS) <= 0) {
        // when only connecting to trusted nodes, do not seed via DNS, or listen by default
        if (args.SoftSetBoolArg("-dnsseed", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -dnsseed=0\n");
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -listen=0\n");
    }

    std::string proxy_arg = args.GetArg("-proxy", "");
    if (proxy_arg != "" && proxy_arg != "0") {
        // to protect privacy, do not listen by default if a default proxy server is specified
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -proxy set -> setting -listen=0\n");
        // to protect privacy, do not map ports when a proxy is set. The user may still specify -listen=1
        // to listen locally, so don't rely on this happening through -listen below.
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -proxy set -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -proxy set -> setting -natpmp=0\n");
        }
        // to protect privacy, do not discover addresses by default
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -proxy set -> setting -discover=0\n");
    }

    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        // do not map ports or try to retrieve public IP when not listening (pointless)
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -listen=0 -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -natpmp=0\n");
        }
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -listen=0 -> setting -discover=0\n");
        if (args.SoftSetBoolArg("-listenonion", false))
            LogInfo("parameter interaction: -listen=0 -> setting -listenonion=0\n");
        if (args.SoftSetBoolArg("-i2pacceptincoming", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -i2pacceptincoming=0\n");
        }
    }

    if (args.IsArgSet("-externalip")) {
        // if an explicit public IP is specified, do not try to find others
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -externalip set -> setting -discover=0\n");
    }

    if (args.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY)) {
        // disable whitelistrelay in blocksonly mode
        if (args.SoftSetBoolArg("-whitelistrelay", false))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -whitelistrelay=0\n");
        // Reduce default mempool size in blocksonly mode to avoid unexpected resource usage
        if (args.SoftSetArg("-maxmempool", ToString(DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB)))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -maxmempool=%d\n", DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    }

    // Forcing relay from whitelisted hosts implies we will accept relays from them in the first place.
    if (args.GetBoolArg("-whitelistforcerelay", DEFAULT_WHITELISTFORCERELAY)) {
        if (args.SoftSetBoolArg("-whitelistrelay", true))
            LogInfo("parameter interaction: -whitelistforcerelay=1 -> setting -whitelistrelay=1\n");
    }
    if (args.IsArgSet("-onlynet")) {
        const auto onlynets = args.GetArgs("-onlynet");
        bool clearnet_reachable = std::any_of(onlynets.begin(), onlynets.end(), [](const auto& net) {
            const auto n = ParseNetwork(net);
            return n == NET_IPV4 || n == NET_IPV6;
        });
        if (!clearnet_reachable && args.SoftSetBoolArg("-dnsseed", false)) {
            LogInfo("parameter interaction: -onlynet excludes IPv4 and IPv6 -> setting -dnsseed=0\n");
        }
    }
}